

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndarray.cc
# Opt level: O1

int TVMArrayFromDLPack(DLManagedTensor *from,TVMArrayHandle *out)

{
  void *pvVar1;
  DLContext DVar2;
  int64_t *piVar3;
  int64_t *piVar4;
  uint64_t uVar5;
  DLDataType DVar6;
  DLTensor *tensor;
  TVMArrayHandle pTVar7;
  NDArray local_20;
  
  pTVar7 = (TVMArrayHandle)operator_new(0x60);
  pTVar7->data = (void *)0x0;
  pTVar7->ndim = 0;
  pTVar7[1].ctx.device_type = 0;
  pTVar7[1].ctx.device_id = 0;
  pTVar7[1].ndim = 0;
  pTVar7[1].dtype.code = '\0';
  pTVar7[1].dtype.bits = '\0';
  pTVar7[1].dtype.lanes = 0;
  pTVar7->byte_offset = 0;
  pTVar7[1].data = (void *)0x0;
  pTVar7[1].shape = (int64_t *)0x0;
  pTVar7[1].strides = (int64_t *)0x0;
  pTVar7->shape = (int64_t *)0x0;
  pTVar7->strides = (int64_t *)0x0;
  pTVar7[1].byte_offset = 0;
  pTVar7[1].ctx = (DLContext)tvm::runtime::NDArray::Internal::DLPackDeleter;
  pTVar7[1].data = from;
  pvVar1 = (from->dl_tensor).data;
  DVar2 = (from->dl_tensor).ctx;
  DVar6 = (from->dl_tensor).dtype;
  piVar3 = (from->dl_tensor).shape;
  piVar4 = (from->dl_tensor).strides;
  uVar5 = (from->dl_tensor).byte_offset;
  pTVar7->ndim = (from->dl_tensor).ndim;
  pTVar7->dtype = DVar6;
  pTVar7->shape = piVar3;
  pTVar7->strides = piVar4;
  pTVar7->byte_offset = uVar5;
  pTVar7->data = pvVar1;
  pTVar7->ctx = DVar2;
  LOCK();
  pTVar7[1].dtype = (DLDataType)((int)pTVar7[1].dtype + 1);
  UNLOCK();
  local_20.data_ = (Container *)0x0;
  *out = pTVar7;
  tvm::runtime::NDArray::~NDArray(&local_20);
  return 0;
}

Assistant:

int TVMArrayFromDLPack(DLManagedTensor *from,
                       TVMArrayHandle *out) {
  API_BEGIN();
  *out = NDArray::Internal::MoveAsDLTensor(NDArray::FromDLPack(from));
  API_END();
}